

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O0

FT_Error FT_Outline_Render(FT_Library library,FT_Outline *outline,FT_Raster_Params *params)

{
  undefined1 local_60 [8];
  FT_BBox cbox;
  FT_ListNode node;
  FT_Renderer_conflict renderer;
  FT_Error error;
  FT_Raster_Params *params_local;
  FT_Outline *outline_local;
  FT_Library library_local;
  
  if (library == (FT_Library)0x0) {
    library_local._4_4_ = 0x21;
  }
  else if (outline == (FT_Outline *)0x0) {
    library_local._4_4_ = 0x14;
  }
  else if (params == (FT_Raster_Params *)0x0) {
    library_local._4_4_ = 6;
  }
  else {
    FT_Outline_Get_CBox(outline,(FT_BBox *)local_60);
    if (((((long)local_60 < -0x1000000) || (cbox.xMin < -0x1000000)) || (0x1000000 < cbox.yMin)) ||
       (0x1000000 < cbox.xMax)) {
      library_local._4_4_ = 0x14;
    }
    else {
      node = (FT_ListNode)library->cur_renderer;
      cbox.yMax = (FT_Pos)(library->renderers).head;
      params->source = outline;
      if (((params->flags & 2U) != 0) && ((params->flags & 4U) == 0)) {
        (params->clip_box).xMin = (long)local_60 >> 6;
        (params->clip_box).yMin = cbox.xMin >> 6;
        (params->clip_box).xMax = cbox.yMin + 0x3f >> 6;
        (params->clip_box).yMax = cbox.xMax + 0x3f >> 6;
      }
      renderer._4_4_ = 0x13;
      while (((node != (FT_ListNode)0x0 &&
              (renderer._4_4_ = (*(code *)node[4].data)(node[4].next,params), renderer._4_4_ != 0))
             && ((renderer._4_4_ & 0xff) == 0x13))) {
        node = (FT_ListNode)
               FT_Lookup_Renderer(library,FT_GLYPH_FORMAT_OUTLINE,(FT_ListNode *)&cbox.yMax);
      }
      library_local._4_4_ = renderer._4_4_;
    }
  }
  return library_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Outline_Render( FT_Library         library,
                     FT_Outline*        outline,
                     FT_Raster_Params*  params )
  {
    FT_Error     error;
    FT_Renderer  renderer;
    FT_ListNode  node;
    FT_BBox      cbox;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !outline )
      return FT_THROW( Invalid_Outline );

    if ( !params )
      return FT_THROW( Invalid_Argument );

    FT_Outline_Get_CBox( outline, &cbox );
    if ( cbox.xMin < -0x1000000L || cbox.yMin < -0x1000000L ||
         cbox.xMax >  0x1000000L || cbox.yMax >  0x1000000L )
      return FT_THROW( Invalid_Outline );

    renderer = library->cur_renderer;
    node     = library->renderers.head;

    params->source = (void*)outline;

    /* preset clip_box for direct mode */
    if ( params->flags & FT_RASTER_FLAG_DIRECT    &&
         !( params->flags & FT_RASTER_FLAG_CLIP ) )
    {
      params->clip_box.xMin = cbox.xMin >> 6;
      params->clip_box.yMin = cbox.yMin >> 6;
      params->clip_box.xMax = ( cbox.xMax + 63 ) >> 6;
      params->clip_box.yMax = ( cbox.yMax + 63 ) >> 6;
    }

    error = FT_ERR( Cannot_Render_Glyph );
    while ( renderer )
    {
      error = renderer->raster_render( renderer->raster, params );
      if ( !error || FT_ERR_NEQ( error, Cannot_Render_Glyph ) )
        break;

      /* FT_Err_Cannot_Render_Glyph is returned if the render mode   */
      /* is unsupported by the current renderer for this glyph image */
      /* format                                                      */

      /* now, look for another renderer that supports the same */
      /* format                                                */
      renderer = FT_Lookup_Renderer( library, FT_GLYPH_FORMAT_OUTLINE,
                                     &node );
    }

    return error;
  }